

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

int linenoiseHistorySetMaxLen(int len)

{
  int iVar1;
  char **__ptr;
  char **__s;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int local_40;
  
  __ptr = history;
  iVar1 = history_len;
  iVar2 = 0;
  if (0 < len) {
    if (history != (char **)0x0) {
      __s = (char **)malloc((ulong)(uint)len << 3);
      if (__s == (char **)0x0) {
        return 0;
      }
      uVar3 = 0;
      uVar4 = iVar1 - len;
      if (uVar4 == 0 || iVar1 < len) {
        local_40 = iVar1;
      }
      else {
        uVar5 = 0;
        if (0 < (int)uVar4) {
          uVar5 = (ulong)uVar4;
        }
        for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
          free(__ptr[uVar3]);
        }
        uVar3 = (ulong)(int)uVar4;
        local_40 = len;
      }
      memset(__s,0,(ulong)(uint)len << 3);
      memcpy(__s,__ptr + uVar3,(long)local_40 << 3);
      free(__ptr);
      history = __s;
    }
    iVar2 = 1;
    history_max_len = len;
    if (len < iVar1) {
      history_len = len;
    }
  }
  return iVar2;
}

Assistant:

int linenoiseHistorySetMaxLen(int len) {
    char **new;

    if (len < 1) return 0;
    if (history) {
        int tocopy = history_len;

        new = malloc(sizeof(char*)*len);
        if (new == NULL) return 0;

        /* If we can't copy everything, free the elements we'll not use. */
        if (len < tocopy) {
            int j;

            for (j = 0; j < tocopy-len; j++) free(history[j]);
            tocopy = len;
        }
        memset(new,0,sizeof(char*)*len);
        memcpy(new,history+(history_len-tocopy), sizeof(char*)*tocopy);
        free(history);
        history = new;
    }
    history_max_len = len;
    if (history_len > history_max_len)
        history_len = history_max_len;
    return 1;
}